

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O1

DdNode * extraZddGetSymmetricVars(DdManager *dd,DdNode *bF,DdNode *bG,DdNode *bVars)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  DdNode *pDVar5;
  int iVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *bG_00;
  int iVar10;
  DdNode *pDVar11;
  
  pDVar9 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar11 = (DdNode *)((ulong)bG & 0xfffffffffffffffe);
  if ((pDVar9->index == 0x7fffffff) && (pDVar11->index == 0x7fffffff)) {
    if (bF == bG) {
      pDVar9 = extraZddGetSingletons(dd,bVars);
      return pDVar9;
    }
    return dd->zero;
  }
  if (dd->one == bVars) {
    __assert_fail("bVars != b1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                  ,0x335,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar5 = cuddCacheLookupZdd(dd,10,bF,bG,bVars);
  if (pDVar5 != (DdNode *)0x0) {
    return pDVar5;
  }
  iVar4 = 0x7fffffff;
  iVar6 = 0x7fffffff;
  if ((ulong)pDVar9->index != 0x7fffffff) {
    iVar6 = dd->perm[pDVar9->index];
  }
  if ((ulong)pDVar11->index != 0x7fffffff) {
    iVar4 = dd->perm[pDVar11->index];
  }
  iVar10 = iVar4;
  if (iVar6 < iVar4) {
    iVar10 = iVar6;
  }
  if (dd->size <= iVar10) {
    __assert_fail("LevelFG < dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                  ,0x34b,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  iVar2 = dd->perm[bVars->index];
  pDVar5 = bVars;
  while (iVar2 < iVar10) {
    pDVar5 = (pDVar5->type).kids.T;
    iVar2 = dd->perm[pDVar5->index];
  }
  if (iVar10 != iVar2) {
    __assert_fail("LevelFG == dd->perm[bVarsNew->index]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                  ,0x350,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar7 = bF;
  pDVar8 = bF;
  if (iVar6 <= iVar4) {
    pDVar8 = (pDVar9->type).kids.E;
    if (pDVar9 == bF) {
      pDVar7 = (pDVar9->type).kids.T;
    }
    else {
      pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
      pDVar7 = (DdNode *)((ulong)(pDVar9->type).kids.T ^ 1);
    }
  }
  pDVar9 = bG;
  bG_00 = bG;
  if (iVar4 <= iVar6) {
    pDVar9 = (pDVar11->type).kids.E;
    if (pDVar11 == bG) {
      bG_00 = (pDVar11->type).kids.T;
    }
    else {
      pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
      bG_00 = (DdNode *)((ulong)(pDVar11->type).kids.T ^ 1);
    }
  }
  pDVar9 = extraZddGetSymmetricVars(dd,pDVar8,pDVar9,(pDVar5->type).kids.T);
  if (pDVar9 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (pDVar9 != dd->zero) {
    pDVar11 = extraZddGetSymmetricVars(dd,pDVar7,bG_00,(pDVar5->type).kids.T);
    if (pDVar11 == (DdNode *)0x0) goto LAB_00806f77;
    piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar7 = cuddZddIntersect(dd,pDVar9,pDVar11);
    if (pDVar7 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar9);
      pDVar9 = pDVar11;
      goto LAB_00806f77;
    }
    piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar9);
    Cudd_RecursiveDerefZdd(dd,pDVar11);
    pDVar9 = pDVar7;
  }
  pDVar11 = pDVar9;
  if (pDVar8 == bG_00) {
    pDVar8 = cuddZddGetNode(dd,pDVar5->index * 2,dd->one,dd->zero);
    if (pDVar8 == (DdNode *)0x0) {
LAB_00806f77:
      Cudd_RecursiveDerefZdd(dd,pDVar9);
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar11 = cuddZddUnion(dd,pDVar9,pDVar8);
    if (pDVar11 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar9);
      pDVar9 = pDVar8;
      goto LAB_00806f77;
    }
    piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar9);
    Cudd_RecursiveDerefZdd(dd,pDVar8);
  }
  if (pDVar5 == bVars || bF != bG) goto LAB_00806f42;
  if (iVar10 <= dd->perm[bVars->index]) {
    __assert_fail("LevelFG > dd->perm[bVars->index]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                  ,0x3b4,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar9 = cuddBddExistAbstractRecur(dd,bVars,pDVar5);
  if (pDVar9 == (DdNode *)0x0) {
LAB_00806f2c:
    Cudd_RecursiveDerefZdd(dd,pDVar11);
    bVar3 = false;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5 = extraZddGetSingletons(dd,pDVar9);
    if (pDVar5 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar9);
      goto LAB_00806f2c;
    }
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar9);
    pDVar9 = cuddZddUnion(dd,pDVar11,pDVar5);
    if (pDVar9 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar11);
      Cudd_RecursiveDerefZdd(dd,pDVar5);
      bVar3 = false;
      pDVar11 = (DdNode *)0x0;
    }
    else {
      piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDerefZdd(dd,pDVar11);
      Cudd_RecursiveDerefZdd(dd,pDVar5);
      bVar3 = true;
      pDVar11 = pDVar9;
    }
  }
  if (!bVar3) {
    return (DdNode *)0x0;
  }
LAB_00806f42:
  piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  cuddCacheInsert(dd,10,bF,bG,bVars,pDVar11);
  return pDVar11;
}

Assistant:

DdNode * extraZddGetSymmetricVars( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,       /* the first function  - originally, the positive cofactor */
  DdNode * bG,       /* the second function - originally, the negative cofactor */
  DdNode * bVars)    /* the set of variables, on which F and G depend */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bF); 
    DdNode * bGR = Cudd_Regular(bG); 

    if ( cuddIsConstant(bFR) && cuddIsConstant(bGR) )
    {
        if ( bF == bG )
            return extraZddGetSingletons( dd, bVars );
        else 
            return z0;
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookupZdd(dd, DD_GET_SYMM_VARS_TAG, bF, bG, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;             
        DdNode * zPlus, * zTemp;
        DdNode * bF0, * bF1;             
        DdNode * bG0, * bG1;             
        DdNode * bVarsNew;
    
        int LevelF = cuddI(dd,bFR->index);
        int LevelG = cuddI(dd,bGR->index);
        int LevelFG;

        if ( LevelF < LevelG )
            LevelFG = LevelF;
        else
            LevelFG = LevelG;

        // at least one of the arguments is not a constant
        assert( LevelFG < dd->size );

        // every variable in bF and bG should be also in bVars, therefore LevelFG cannot be above LevelV
        // if LevelFG is below LevelV, scroll through the vars in bVars to the same level as LevelFG
        for ( bVarsNew = bVars; LevelFG > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) );
        assert( LevelFG == dd->perm[bVarsNew->index] );

        // cofactor the functions
        if ( LevelF == LevelFG )
        {
            if ( bFR != bF ) // bF is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }
        }
        else 
            bF0 = bF1 = bF;

        if ( LevelG == LevelFG )
        {
            if ( bGR != bG ) // bG is complemented 
            {
                bG0 = Cudd_Not( cuddE(bGR) );
                bG1 = Cudd_Not( cuddT(bGR) );
            }
            else
            {
                bG0 = cuddE(bGR);
                bG1 = cuddT(bGR);
            }
        }
        else 
            bG0 = bG1 = bG;

        // solve subproblems
        zRes0 = extraZddGetSymmetricVars( dd, bF0, bG0, cuddT(bVarsNew) );
        if ( zRes0 == NULL ) 
            return NULL;
        cuddRef( zRes0 );

        // if there is not symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddGetSymmetricVars( dd, bF1, bG1, cuddT(bVarsNew) );
            if ( zRes1 == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables should belong to the resulting set 
            // for which the property is true for both cofactors
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // add one more singleton if the property is true for this variable
        if ( bF0 == bG1 )
        {
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these variable pairs to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }

        if ( bF == bG && bVars != bVarsNew )
        { 
            // if the functions are equal, so are their cofactors
            // add those variables from V that are above F and G 

            DdNode * bVarsExtra;

            assert( LevelFG > dd->perm[bVars->index] );

            // create the BDD of the extra variables
            bVarsExtra = cuddBddExistAbstractRecur( dd, bVars, bVarsNew );
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            zPlus = extraZddGetSingletons( dd, bVarsExtra );
            if ( zPlus == NULL )
            {
                Cudd_RecursiveDeref( dd, bVarsExtra );
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );
            Cudd_RecursiveDeref( dd, bVarsExtra );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        cuddDeref( zRes );

        cuddCacheInsert( dd, DD_GET_SYMM_VARS_TAG, bF, bG, bVars, zRes );
        return zRes;
    }
}